

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDEdge *e,double edge_s,ON_SubDFace *active_face)

{
  bool bVar1;
  uint i;
  ON_SubDFacePtr fptr;
  anon_union_8_3_7b68a318_for_m_p1 local_30;
  ON_SubDComponentId local_28;
  
  this->m_cid = ON_SubDComponentId::Unset;
  (this->m_p0).eptr_s = 0.0;
  (this->m_p1).f_corner_t = 0.0;
  ON_SubDComponentId::ON_SubDComponentId(&local_28,e);
  bVar1 = Internal_Init(this,local_28);
  if (bVar1) {
    this->m_p0 = (anon_union_8_3_6bf0bb0e_for_m_p0)
                 (~-(ulong)(0.0 <= edge_s) & (ulong)ON_DBL_QNAN |
                 (~-(ulong)(edge_s <= 1.0) & (ulong)ON_DBL_QNAN |
                 -(ulong)(edge_s <= 1.0) & (ulong)edge_s) & -(ulong)(0.0 <= edge_s));
    if (active_face != (ON_SubDFace *)0x0) {
      i = ON_SubDEdge::FaceArrayIndex(e,active_face);
      fptr = ON_SubDEdge::FacePtr(e,i);
      ON_SubDComponentId::ON_SubDComponentId(&local_30.v_active_f,fptr);
      this->m_p1 = local_30;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDEdge* e,
  double edge_s,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(e)))
  {
    m_p0.eptr_s = (edge_s >= 0.0 && edge_s <= 1.0) ? edge_s : ON_DBL_QNAN;
    if (nullptr != active_face)
    {
      const unsigned efi = e->FaceArrayIndex(active_face);
      m_p1.e_active_f = e->FacePtr(efi);
    }
  }
}